

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

void Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::CalculateHitGroupIndex
               (InstanceDesc *Desc,Uint32 *InstanceOffset,Uint32 HitGroupStride,
               HIT_GROUP_BINDING_MODE BindingMode)

{
  Uint32 UVar1;
  BottomLevelASVkImpl *this;
  Char *pCVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  uint *Args_1;
  undefined1 local_b8 [8];
  string msg_3;
  undefined1 local_90 [4];
  Uint32 MaxIndex;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  HIT_GROUP_BINDING_MODE BindingMode_local;
  Uint32 HitGroupStride_local;
  Uint32 *InstanceOffset_local;
  InstanceDesc *Desc_local;
  
  Args_1 = (uint *)CONCAT71(in_register_00000009,BindingMode);
  msg.field_2._M_local_buf[0xb] = BindingMode;
  msg.field_2._12_4_ = HitGroupStride;
  if (Desc->ContributionToHitGroupIndex == 0xffffffff) {
    Desc->ContributionToHitGroupIndex = *InstanceOffset;
    Args_1 = &switchD_0027382e::switchdataD_00c09f7c;
    switch(BindingMode) {
    case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:
      this = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator->(&Desc->pBLAS);
      UVar1 = BottomLevelASBase<Diligent::EngineVkImplTraits>::GetActualGeometryCount
                        (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
      uVar3 = UVar1 * msg.field_2._12_4_ + *InstanceOffset;
      Args_1 = (uint *)(ulong)uVar3;
      *InstanceOffset = uVar3;
      break;
    case HIT_GROUP_BINDING_MODE_PER_INSTANCE:
      Args_1 = (uint *)(ulong)(HitGroupStride + *InstanceOffset);
      *InstanceOffset = HitGroupStride + *InstanceOffset;
      break;
    case HIT_GROUP_BINDING_MODE_PER_TLAS:
      break;
    case HIT_GROUP_BINDING_MODE_LAST:
      FormatString<char[85]>
                ((string *)local_40,
                 (char (*) [85])
                 "TLAS_INSTANCE_OFFSET_AUTO is not compatible with HIT_GROUP_BINDING_MODE_USER_DEFINED"
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (uint *)0x173;
      DebugAssertionFailed
                (pCVar2,"CalculateHitGroupIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0x173);
      std::__cxx11::string::~string((string *)local_40);
      break;
    default:
      FormatString<char[40]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [40])"Unknown ray tracing shader binding mode");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (uint *)0x174;
      DebugAssertionFailed
                (pCVar2,"CalculateHitGroupIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0x174);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
  }
  else if (BindingMode != HIT_GROUP_BINDING_MODE_LAST) {
    FormatString<char[56]>
              ((string *)local_90,
               (char (*) [56])"BindingMode must be HIT_GROUP_BINDING_MODE_USER_DEFINED");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (uint *)0x17a;
    DebugAssertionFailed
              (pCVar2,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x17a);
    std::__cxx11::string::~string((string *)local_90);
  }
  msg_3.field_2._12_4_ = 0x1000000;
  if (0xffffff < Desc->ContributionToHitGroupIndex) {
    FormatString<char[47],unsigned_int>
              ((string *)local_b8,(Diligent *)"ContributionToHitGroupIndex must be less than ",
               (char (*) [47])((long)&msg_3.field_2 + 0xc),Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x17e);
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

static void CalculateHitGroupIndex(InstanceDesc& Desc, Uint32& InstanceOffset, const Uint32 HitGroupStride, const HIT_GROUP_BINDING_MODE BindingMode)
    {
        static_assert(HIT_GROUP_BINDING_MODE_LAST == HIT_GROUP_BINDING_MODE_USER_DEFINED, "Please update the switch below to handle the new shader binding mode");

        if (Desc.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO)
        {
            Desc.ContributionToHitGroupIndex = InstanceOffset;
            switch (BindingMode)
            {
                // clang-format off
                case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:     InstanceOffset += Desc.pBLAS->GetActualGeometryCount() * HitGroupStride;                            break;
                case HIT_GROUP_BINDING_MODE_PER_INSTANCE:     InstanceOffset += HitGroupStride;                                                                   break;
                case HIT_GROUP_BINDING_MODE_PER_TLAS:         /* InstanceOffset is constant */                                                                  break;
                case HIT_GROUP_BINDING_MODE_USER_DEFINED:     UNEXPECTED("TLAS_INSTANCE_OFFSET_AUTO is not compatible with HIT_GROUP_BINDING_MODE_USER_DEFINED"); break;
                default:                                      UNEXPECTED("Unknown ray tracing shader binding mode");
                    // clang-format on
            }
        }
        else
        {
            VERIFY(BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED, "BindingMode must be HIT_GROUP_BINDING_MODE_USER_DEFINED");
        }

        constexpr Uint32 MaxIndex = (1u << 24);
        VERIFY(Desc.ContributionToHitGroupIndex < MaxIndex, "ContributionToHitGroupIndex must be less than ", MaxIndex);
    }